

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::quath>
          (Attribute *this,double t,quath *dst,TimeSampleInterpolationType tinterp)

{
  half hVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::quath> local_4c;
  undefined1 local_42 [8];
  optional<tinyusdz::value::quath> v;
  TimeSampleInterpolationType tinterp_local;
  quath *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (quath *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&v.contained,t);
    bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)&v.contained);
    if ((bVar2) && (bVar2 = has_value(this), bVar2)) {
      primvar::PrimVar::get_value<tinyusdz::value::quath>(&local_4c,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::quath>::optional<tinyusdz::value::quath,_0>
                ((optional<tinyusdz::value::quath> *)local_42,&local_4c);
      nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional(&local_4c);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_42);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::quath>::value
                           ((optional<tinyusdz::value::quath> *)local_42);
        hVar1.value = (pvVar3->real).value;
        dst->imag = (half3)(pvVar3->imag)._M_elems[0];
        dst->real = (half)hVar1.value;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional
                ((optional<tinyusdz::value::quath> *)local_42);
      if (bVar2) goto LAB_002e2928;
    }
    bVar2 = has_timesamples(this);
    if (bVar2) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::quath>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::quath>(this,dst);
    }
  }
LAB_002e2928:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }